

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::PaddingLayerParams::MergeFrom
          (PaddingLayerParams *this,PaddingLayerParams *from)

{
  uint32 uVar1;
  void *pvVar2;
  LogMessage *other;
  BorderAmounts *this_00;
  PaddingLayerParams_PaddingReflection *this_01;
  PaddingLayerParams_PaddingReplication *this_02;
  PaddingLayerParams_PaddingConstant *this_03;
  BorderAmounts *from_00;
  PaddingLayerParams_PaddingReflection *from_01;
  PaddingLayerParams_PaddingReplication *from_02;
  PaddingLayerParams_PaddingConstant *from_03;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x87d1);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  from_00 = from->paddingamounts_;
  if (from_00 != (BorderAmounts *)0x0 &&
      from != (PaddingLayerParams *)&_PaddingLayerParams_default_instance_) {
    this_00 = this->paddingamounts_;
    if (this_00 == (BorderAmounts *)0x0) {
      this_00 = (BorderAmounts *)operator_new(0x30);
      BorderAmounts::BorderAmounts(this_00);
      this->paddingamounts_ = this_00;
      from_00 = from->paddingamounts_;
    }
    if (from_00 == (BorderAmounts *)0x0) {
      from_00 = (BorderAmounts *)&_BorderAmounts_default_instance_;
    }
    BorderAmounts::MergeFrom(this_00,from_00);
  }
  uVar1 = from->_oneof_case_[0];
  if (uVar1 != 3) {
    if (uVar1 != 2) {
      if (uVar1 != 1) {
        return;
      }
      if (this->_oneof_case_[0] == 1) {
        this_03 = (this->PaddingType_).constant_;
      }
      else {
        clear_PaddingType(this);
        this->_oneof_case_[0] = 1;
        this_03 = (PaddingLayerParams_PaddingConstant *)operator_new(0x18);
        PaddingLayerParams_PaddingConstant::PaddingLayerParams_PaddingConstant(this_03);
        (this->PaddingType_).constant_ = this_03;
        if (from->_oneof_case_[0] != 1) {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          from_03 = (PaddingLayerParams_PaddingConstant *)
                    &_PaddingLayerParams_PaddingConstant_default_instance_;
          goto LAB_00464dbb;
        }
      }
      from_03 = (from->PaddingType_).constant_;
LAB_00464dbb:
      PaddingLayerParams_PaddingConstant::MergeFrom(this_03,from_03);
      return;
    }
    if (this->_oneof_case_[0] == 2) {
      this_01 = (this->PaddingType_).reflection_;
    }
    else {
      clear_PaddingType(this);
      this->_oneof_case_[0] = 2;
      this_01 = (PaddingLayerParams_PaddingReflection *)operator_new(0x18);
      PaddingLayerParams_PaddingReflection::PaddingLayerParams_PaddingReflection(this_01);
      (this->PaddingType_).reflection_ = this_01;
      if (from->_oneof_case_[0] != 2) {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        from_01 = (PaddingLayerParams_PaddingReflection *)
                  &_PaddingLayerParams_PaddingReflection_default_instance_;
        goto LAB_00464d8f;
      }
    }
    from_01 = (from->PaddingType_).reflection_;
LAB_00464d8f:
    PaddingLayerParams_PaddingReflection::MergeFrom(this_01,from_01);
    return;
  }
  if (this->_oneof_case_[0] == 3) {
    this_02 = (this->PaddingType_).replication_;
  }
  else {
    clear_PaddingType(this);
    this->_oneof_case_[0] = 3;
    this_02 = (PaddingLayerParams_PaddingReplication *)operator_new(0x18);
    PaddingLayerParams_PaddingReplication::PaddingLayerParams_PaddingReplication(this_02);
    (this->PaddingType_).replication_ = this_02;
    if (from->_oneof_case_[0] != 3) {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_02 = (PaddingLayerParams_PaddingReplication *)
                &_PaddingLayerParams_PaddingReplication_default_instance_;
      goto LAB_00464da5;
    }
  }
  from_02 = (from->PaddingType_).replication_;
LAB_00464da5:
  PaddingLayerParams_PaddingReplication::MergeFrom(this_02,from_02);
  return;
}

Assistant:

void PaddingLayerParams::MergeFrom(const PaddingLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.PaddingLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_paddingamounts()) {
    mutable_paddingamounts()->::CoreML::Specification::BorderAmounts::MergeFrom(from.paddingamounts());
  }
  switch (from.PaddingType_case()) {
    case kConstant: {
      mutable_constant()->::CoreML::Specification::PaddingLayerParams_PaddingConstant::MergeFrom(from.constant());
      break;
    }
    case kReflection: {
      mutable_reflection()->::CoreML::Specification::PaddingLayerParams_PaddingReflection::MergeFrom(from.reflection());
      break;
    }
    case kReplication: {
      mutable_replication()->::CoreML::Specification::PaddingLayerParams_PaddingReplication::MergeFrom(from.replication());
      break;
    }
    case PADDINGTYPE_NOT_SET: {
      break;
    }
  }
}